

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversionStamp.cpp
# Opt level: O0

void __thiscall OpenMD::InversionStamp::~InversionStamp(InversionStamp *this)

{
  DataHolder *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  in_RDI->_vptr_DataHolder = (_func_int **)&PTR__InversionStamp_00501238;
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::__cxx11::string::~string
            ((string *)
             &in_RDI[1].deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  Parameter<int>::~Parameter((Parameter<int> *)0x34156d);
  DataHolder::~DataHolder(in_RDI);
  return;
}

Assistant:

InversionStamp::~InversionStamp() {}